

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_nthroot(mp_int *y,uint n,mp_int *remainder_out)

{
  ulong uVar1;
  uint which;
  ulong factor1;
  undefined8 *ptr;
  mp_int *pmVar2;
  size_t sVar3;
  uint uVar4;
  ulong local_90;
  size_t i_3;
  mp_int *root;
  size_t i_2;
  uint newbit;
  uint32_t binom_mul;
  size_t j;
  ulong uStack_60;
  uint16_t binom;
  size_t i_1;
  size_t s;
  size_t i;
  size_t nalloc;
  mp_int *scratch;
  mp_int **newpowers;
  mp_int **powers;
  mp_int **alloc;
  mp_int *remainder_out_local;
  uint n_local;
  mp_int *y_local;
  
  factor1 = (ulong)((n + 1) * 2 + 1);
  ptr = (undefined8 *)safemalloc(factor1,8,0);
  for (s = 0; s < factor1; s = s + 1) {
    pmVar2 = mp_make_sized(y->nw + 1);
    ptr[s] = pmVar2;
  }
  uVar4 = n + 1;
  pmVar2 = (mp_int *)ptr[n * 2 + 2];
  mp_copy_integer_into((mp_int *)*ptr,1);
  sVar3 = mp_max_bits(y);
  i_1 = sVar3 / n + 1;
  do {
    sVar3 = i_1 - 1;
    if (i_1 == 0) {
      if (remainder_out != (mp_int *)0x0) {
        mp_sub_into(remainder_out,y,(mp_int *)ptr[n]);
      }
      sVar3 = mp_max_bits(y);
      pmVar2 = mp_new(sVar3 / n);
      mp_copy_into(pmVar2,(mp_int *)ptr[1]);
      for (local_90 = 0; local_90 < factor1; local_90 = local_90 + 1) {
        mp_free((mp_int *)ptr[local_90]);
      }
      safefree(ptr);
      return pmVar2;
    }
    for (uStack_60 = 0; uStack_60 < n + 1; uStack_60 = uStack_60 + 1) {
      j._6_2_ = 1;
      mp_copy_into((mp_int *)ptr[uVar4 + uStack_60],(mp_int *)ptr[uStack_60]);
      for (_newbit = 0; _newbit < uStack_60; _newbit = _newbit + 1) {
        mp_mul_integer_into(pmVar2,(mp_int *)ptr[_newbit],j._6_2_);
        mp_lshift_fixed_into(pmVar2,pmVar2,(uStack_60 - _newbit) * sVar3);
        mp_add_into((mp_int *)ptr[uVar4 + uStack_60],(mp_int *)ptr[uVar4 + uStack_60],pmVar2);
        uVar1 = (ulong)((uint)j._6_2_ * ((int)uStack_60 - (int)_newbit)) / (_newbit + 1);
        if (0xffff < (uint)uVar1) {
          __assert_fail("binom_mul < 0x10000",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                        ,0x9ac,"mp_int *mp_nthroot(mp_int *, unsigned int, mp_int *)");
        }
        j._6_2_ = (ushort)uVar1;
      }
    }
    which = mp_cmp_hs(y,(mp_int *)ptr[(ulong)uVar4 + (ulong)n]);
    for (root = (mp_int *)0x0; i_1 = sVar3, root < (mp_int *)(ulong)(n + 1);
        root = (mp_int *)((long)&root->nw + 1)) {
      mp_select_into((mp_int *)ptr[(long)root],(mp_int *)ptr[(long)root],
                     (mp_int *)ptr[(long)&root->nw + (ulong)uVar4],which);
    }
  } while( true );
}

Assistant:

mp_int *mp_nthroot(mp_int *y, unsigned n, mp_int *remainder_out)
{
    /*
     * Allocate scratch space.
     */
    mp_int **alloc, **powers, **newpowers, *scratch;
    size_t nalloc = 2*(n+1)+1;
    alloc = snewn(nalloc, mp_int *);
    for (size_t i = 0; i < nalloc; i++)
        alloc[i] = mp_make_sized(y->nw + 1);
    powers = alloc;
    newpowers = alloc + (n+1);
    scratch = alloc[2*n+2];

    /*
     * We're computing the rounded-down nth root of y, i.e. the
     * maximal x such that x^n <= y. We try to add 2^i to it for each
     * possible value of i, starting from the largest one that might
     * fit (i.e. such that 2^{n*i} fits in the size of y) downwards to
     * i=0.
     *
     * We track all the smaller powers of x in the array 'powers'. In
     * each iteration, if we update x, we update all of those values
     * to match.
     */
    mp_copy_integer_into(powers[0], 1);
    for (size_t s = mp_max_bits(y) / n + 1; s-- > 0 ;) {
        /*
         * Let b = 2^s. We need to compute the powers (x+b)^i for each
         * i, starting from our recorded values of x^i.
         */
        for (size_t i = 0; i < n+1; i++) {
            /*
             * (x+b)^i = x^i
             *         + (i choose 1) x^{i-1} b
             *         + (i choose 2) x^{i-2} b^2
             *         + ...
             *         + b^i
             */
            uint16_t binom = 1;       /* coefficient of b^i */
            mp_copy_into(newpowers[i], powers[i]);
            for (size_t j = 0; j < i; j++) {
                /* newpowers[i] += binom * powers[j] * 2^{(i-j)*s} */
                mp_mul_integer_into(scratch, powers[j], binom);
                mp_lshift_fixed_into(scratch, scratch, (i-j) * s);
                mp_add_into(newpowers[i], newpowers[i], scratch);

                uint32_t binom_mul = binom;
                binom_mul *= (i-j);
                binom_mul /= (j+1);
                assert(binom_mul < 0x10000);
                binom = binom_mul;
            }
        }

        /*
         * Now, is the new value of x^n still <= y? If so, update.
         */
        unsigned newbit = mp_cmp_hs(y, newpowers[n]);
        for (size_t i = 0; i < n+1; i++)
            mp_select_into(powers[i], powers[i], newpowers[i], newbit);
    }

    if (remainder_out)
        mp_sub_into(remainder_out, y, powers[n]);

    mp_int *root = mp_new(mp_max_bits(y) / n);
    mp_copy_into(root, powers[1]);

    for (size_t i = 0; i < nalloc; i++)
        mp_free(alloc[i]);
    sfree(alloc);

    return root;
}